

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O3

bool __thiscall
MutableS2ShapeIndex::Init(MutableS2ShapeIndex *this,Decoder *decoder,ShapeFactory *shape_factory)

{
  bool bVar1;
  uint num_shape_ids;
  uchar *puVar2;
  unsigned_long_long uVar3;
  S2ShapeIndexCell *this_00;
  unsigned_long_long uVar4;
  uint uVar5;
  ulong uVar6;
  uint64 uVar7;
  iterator position;
  EncodedS2CellIdVector cell_ids;
  uint64 max_edges_version;
  Decoder decoder_1;
  EncodedStringVector encoded_cells;
  EncodedS2CellIdVector local_98;
  ulong local_78;
  key_type local_70;
  S2ShapeIndexCell *local_68;
  Decoder local_60;
  EncodedStringVector local_48;
  
  ReleaseAll((vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
              *)&local_98,this);
  std::
  vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  ::~vector((vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
             *)&local_98);
  puVar2 = (uchar *)Varint::Parse64WithLimit
                              ((char *)decoder->buf_,(char *)decoder->limit_,&local_78);
  if ((puVar2 != (uchar *)0x0) && (decoder->buf_ = puVar2, (local_78 & 3) == 0)) {
    (this->options_).max_edges_per_cell_ = (int)(local_78 >> 2);
    num_shape_ids = (*shape_factory->_vptr_ShapeFactory[2])(shape_factory);
    std::
    vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
    ::reserve(&this->shapes_,(ulong)num_shape_ids);
    if (num_shape_ids != 0) {
      uVar6 = 0;
      do {
        (*shape_factory->_vptr_ShapeFactory[3])(&local_98,shape_factory,uVar6);
        if ((long *)local_98.deltas_.data_ != (long *)0x0) {
          *(int *)((long)local_98.deltas_.data_ + 8) = (int)uVar6;
        }
        std::
        vector<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>,std::allocator<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>>>
        ::emplace_back<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>>
                  ((vector<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>,std::allocator<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>>>
                    *)&this->shapes_,(unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_98
                  );
        if ((long *)local_98.deltas_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_98.deltas_.data_ + 8))();
        }
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
      } while (num_shape_ids != uVar5);
    }
    bVar1 = s2coding::EncodedS2CellIdVector::Init(&local_98,decoder);
    if ((bVar1) && (bVar1 = s2coding::EncodedStringVector::Init(&local_48,decoder), bVar1)) {
      if (local_98.deltas_.size_ == 0) {
        return true;
      }
      uVar5 = 0;
      while( true ) {
        uVar3 = s2coding::EncodedUintVector<unsigned_long_long>::operator[](&local_98.deltas_,uVar5)
        ;
        uVar7 = local_98.base_ + (uVar3 << (local_98.shift_ & 0x3f));
        this_00 = (S2ShapeIndexCell *)operator_new(0x10);
        *(undefined8 *)
         &(this_00->shapes_).
          super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> = 0;
        (this_00->shapes_).super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
        .field_7.pointer_ = (S2ClippedShape *)0x0;
        if (uVar5 == 0) {
          uVar3 = 0;
        }
        else {
          uVar3 = s2coding::EncodedUintVector<unsigned_long_long>::operator[]
                            (&local_48.offsets_,uVar5 - 1);
        }
        uVar4 = s2coding::EncodedUintVector<unsigned_long_long>::operator[]
                          (&local_48.offsets_,uVar5);
        local_60.orig_ = (uchar *)(local_48.data_ + uVar3);
        local_60.limit_ = (uchar *)(local_48.data_ + uVar4);
        local_60.buf_ = local_60.orig_;
        bVar1 = S2ShapeIndexCell::Decode(this_00,num_shape_ids,&local_60);
        if (!bVar1) break;
        position = gtl::internal_btree::
                   btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                   ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                          *)&this->cell_map_);
        local_70.id_ = uVar7;
        local_68 = this_00;
        gtl::internal_btree::
        btree<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
        ::insert_hint_unique<std::pair<S2CellId_const,S2ShapeIndexCell*>>
                  ((btree<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
                    *)&this->cell_map_,position,&local_70,
                   (pair<const_S2CellId,_S2ShapeIndexCell_*> *)&local_70);
        uVar5 = uVar5 + 1;
        if (local_98.deltas_.size_ <= uVar5) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool MutableS2ShapeIndex::Init(Decoder* decoder,
                               const ShapeFactory& shape_factory) {
  Clear();
  uint64 max_edges_version;
  if (!decoder->get_varint64(&max_edges_version)) return false;
  int version = max_edges_version & 3;
  if (version != kCurrentEncodingVersionNumber) return false;
  options_.set_max_edges_per_cell(max_edges_version >> 2);
  uint32 num_shapes = shape_factory.size();
  shapes_.reserve(num_shapes);
  for (int shape_id = 0; shape_id < num_shapes; ++shape_id) {
    auto shape = shape_factory[shape_id];
    if (shape) shape->id_ = shape_id;
    shapes_.push_back(std::move(shape));
  }

  s2coding::EncodedS2CellIdVector cell_ids;
  s2coding::EncodedStringVector encoded_cells;
  if (!cell_ids.Init(decoder)) return false;
  if (!encoded_cells.Init(decoder)) return false;

  for (int i = 0; i < cell_ids.size(); ++i) {
    S2CellId id = cell_ids[i];
    S2ShapeIndexCell* cell = new S2ShapeIndexCell;
    Decoder decoder = encoded_cells.GetDecoder(i);
    if (!cell->Decode(num_shapes, &decoder)) return false;
    cell_map_.insert(cell_map_.end(), std::make_pair(id, cell));
  }
  return true;
}